

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status filemgr_destroy_file(char *filename,filemgr_config *config,hash *destroy_file_set)

{
  uint32_t uVar1;
  fdb_status fVar2;
  int iVar3;
  undefined4 uVar4;
  hash_elem *phVar5;
  filemgr_ops *pfVar6;
  long lVar7;
  size_t sVar8;
  ushort *puVar9;
  undefined1 *puVar10;
  encryptor *in_stack_fffffffffffff908;
  filemgr *in_stack_fffffffffffff910;
  filemgr_config *in_stack_fffffffffffff918;
  filemgr_config *in_stack_fffffffffffff920;
  undefined1 local_698 [312];
  err_log_callback *in_stack_fffffffffffffaa0;
  filemgr *in_stack_fffffffffffffaa8;
  hash *destroy_file_set_00;
  hash *phVar11;
  memory_order order;
  undefined6 in_stack_fffffffffffffc60;
  undefined2 in_stack_fffffffffffffc66;
  hash_elem *phStack_398;
  uint16_t old_filename_len;
  uint16_t *old_filename_len_ptr;
  hash *phStack_388;
  uint16_t new_filename_len;
  uint16_t *new_filename_len_ptr;
  size_t old_fnamelen_off;
  size_t new_fnamelen_off;
  cs_off_t offset;
  char *old_filename;
  fdb_status status;
  hash_elem *e;
  filemgr query;
  hash *destroy_set;
  hash to_destroy_files;
  filemgr *file;
  hash *destroy_file_set_local;
  filemgr_config *config_local;
  char *filename_local;
  
  to_destroy_files.avl_cmp = (avl_cmp_func *)0x0;
  destroy_file_set_00 = destroy_file_set;
  if (destroy_file_set == (hash *)0x0) {
    destroy_file_set_00 = (hash *)&destroy_set;
  }
  old_filename._4_4_ = FDB_RESULT_SUCCESS;
  phVar11 = destroy_file_set_00;
  if (destroy_file_set == (hash *)0x0) {
    hash_init((hash *)CONCAT26(old_filename_len_ptr._6_2_,
                               CONCAT24(old_filename_len_ptr._4_2_,old_filename_len_ptr._0_4_)),
              phStack_398._4_4_,
              (hash_hash_func *)CONCAT26(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60),
              (hash_cmp_func *)destroy_file_set_00);
  }
  order = (memory_order)((ulong)phVar11 >> 0x20);
  phVar5 = hash_find((hash *)CONCAT26(old_filename_len_ptr._6_2_,
                                      CONCAT24(old_filename_len_ptr._4_2_,old_filename_len_ptr._0_4_
                                              )),phStack_398);
  if (phVar5 != (hash_elem *)0x0) {
    if (destroy_file_set == (hash *)0x0) {
      hash_free((hash *)0x12c451);
    }
    return FDB_RESULT_SUCCESS;
  }
  hash_insert((hash *)CONCAT26(old_filename_len_ptr._6_2_,
                               CONCAT24(old_filename_len_ptr._4_2_,old_filename_len_ptr._0_4_)),
              phStack_398);
  phVar5 = hash_find((hash *)CONCAT26(old_filename_len_ptr._6_2_,
                                      CONCAT24(old_filename_len_ptr._4_2_,old_filename_len_ptr._0_4_
                                              )),phStack_398);
  if (phVar5 == (hash_elem *)0x0) {
    to_destroy_files.avl_cmp = (avl_cmp_func *)local_698;
    memset(to_destroy_files.avl_cmp,0,0x2f0);
    *(char **)to_destroy_files.avl_cmp = filename;
    pfVar6 = get_filemgr_ops();
    *(filemgr_ops **)(to_destroy_files.avl_cmp + 0xe8) = pfVar6;
    uVar4 = (*(code *)**(undefined8 **)(to_destroy_files.avl_cmp + 0xe8))
                      (*(undefined8 *)to_destroy_files.avl_cmp,2,0x1b6);
    *(undefined4 *)(to_destroy_files.avl_cmp + 0x14) = uVar4;
    *(int *)(to_destroy_files.avl_cmp + 0x10) = global_config.blocksize;
    *(undefined1 **)(to_destroy_files.avl_cmp + 0x110) = &stack0xfffffffffffff908;
    filemgr_config::operator=(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    fdb_init_encryptor(in_stack_fffffffffffff908,(fdb_encryption_key *)0x12c6b7);
    puVar10 = &stack0xfffffffffffff908;
    if (*(int *)(to_destroy_files.avl_cmp + 0x14) < 0) {
      if (*(int *)(to_destroy_files.avl_cmp + 0x14) != -3) {
        if (destroy_file_set == (hash *)0x0) {
          hash_free((hash *)0x12c6db);
        }
        return *(fdb_status *)(to_destroy_files.avl_cmp + 0x14);
      }
    }
    else {
      lVar7 = (**(code **)(*(long *)(to_destroy_files.avl_cmp + 0xe8) + 0x20))
                        (*(undefined4 *)(to_destroy_files.avl_cmp + 0x14));
      if (lVar7 < 0) {
        if (destroy_file_set == (hash *)0x0) {
          hash_free((hash *)0x12c728);
        }
        return (fdb_status)lVar7;
      }
      atomic_store_uint64_t
                ((atomic<unsigned_long> *)in_stack_fffffffffffff910,
                 (uint64_t)in_stack_fffffffffffff908,memory_order_relaxed);
      if ((*(long *)(to_destroy_files.avl_cmp + 0x110) == 0) ||
         ((*(byte *)(*(long *)(to_destroy_files.avl_cmp + 0x110) + 0x10) & 0x20) == 0)) {
        *(undefined4 *)(to_destroy_files.avl_cmp + 0x228) = 1;
      }
      else {
        *(undefined4 *)(to_destroy_files.avl_cmp + 0x228) = 1;
      }
      fVar2 = _filemgr_load_sb(in_stack_fffffffffffff910,
                               (err_log_callback *)in_stack_fffffffffffff908);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        if (destroy_file_set == (hash *)0x0) {
          hash_free((hash *)0x12c7bf);
        }
        (**(code **)(*(long *)(to_destroy_files.avl_cmp + 0xe8) + 0x18))
                  (*(undefined4 *)(to_destroy_files.avl_cmp + 0x14));
        return fVar2;
      }
      fVar2 = _filemgr_read_header(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        if (destroy_file_set == (hash *)0x0) {
          hash_free((hash *)0x12c811);
        }
        (**(code **)(*(long *)(to_destroy_files.avl_cmp + 0xe8) + 0x18))
                  (*(undefined4 *)(to_destroy_files.avl_cmp + 0x14));
        if (sb_ops.release == (_func_fdb_status_filemgr_ptr *)0x0) {
          return fVar2;
        }
        if (*(long *)(to_destroy_files.avl_cmp + 0x198) == 0) {
          return fVar2;
        }
        (*sb_ops.release)((filemgr *)to_destroy_files.avl_cmp);
        return fVar2;
      }
      old_filename._4_4_ = FDB_RESULT_SUCCESS;
      if (*(long *)(to_destroy_files.avl_cmp + 0xe0) != 0) {
        sVar8 = ver_get_new_filename_off(*(filemgr_magic_t *)(to_destroy_files.avl_cmp + 400));
        puVar9 = (ushort *)(*(long *)(to_destroy_files.avl_cmp + 0xe0) + sVar8 + 2);
        if (*puVar9 >> 8 != 0 || (*puVar9 & 0xff) != 0) {
          old_filename._4_4_ =
               filemgr_destroy_file
                         ((char *)(*(long *)(to_destroy_files.avl_cmp + 0xe0) + sVar8 + 2 + 2 +
                                  (long)(int)(uint)(ushort)(*(ushort *)
                                                             (*(long *)(to_destroy_files.avl_cmp +
                                                                       0xe0) + sVar8) >> 8 |
                                                           *(ushort *)
                                                            (*(long *)(to_destroy_files.avl_cmp +
                                                                      0xe0) + sVar8) << 8)),config,
                          destroy_file_set_00);
        }
        free(*(void **)(to_destroy_files.avl_cmp + 0xe0));
      }
      (**(code **)(*(long *)(to_destroy_files.avl_cmp + 0xe8) + 0x18))
                (*(undefined4 *)(to_destroy_files.avl_cmp + 0x14));
      if ((sb_ops.release != (_func_fdb_status_filemgr_ptr *)0x0) &&
         (*(long *)(to_destroy_files.avl_cmp + 0x198) != 0)) {
        (*sb_ops.release)((filemgr *)to_destroy_files.avl_cmp);
      }
      if (((old_filename._4_4_ == FDB_RESULT_SUCCESS) &&
          (fVar2 = filemgr_does_file_exist((char *)in_stack_fffffffffffff918),
          fVar2 == FDB_RESULT_SUCCESS)) && (iVar3 = remove(filename), iVar3 != 0)) {
        old_filename._4_4_ = FDB_RESULT_FILE_REMOVE_FAIL;
      }
    }
  }
  else {
    to_destroy_files.avl_cmp = (avl_cmp_func *)(phVar5 + -10);
    pthread_spin_lock((pthread_spinlock_t *)&phVar5[7].avl.left);
    uVar1 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT26(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60),order)
    ;
    if (uVar1 != 0) {
      pthread_spin_unlock((pthread_spinlock_t *)(to_destroy_files.avl_cmp + 0x1a0));
      if (destroy_file_set == (hash *)0x0) {
        hash_free((hash *)0x12c507);
      }
      return FDB_RESULT_FILE_IS_BUSY;
    }
    pthread_spin_unlock((pthread_spinlock_t *)(to_destroy_files.avl_cmp + 0x1a0));
    if ((*(long *)(to_destroy_files.avl_cmp + 0x118) != 0) &&
       (old_filename._4_4_ =
             filemgr_destroy_file
                       (*(char **)(to_destroy_files.avl_cmp + 0x118),config,destroy_file_set_00),
       old_filename._4_4_ != FDB_RESULT_SUCCESS)) {
      if (destroy_file_set != (hash *)0x0) {
        return old_filename._4_4_;
      }
      hash_free((hash *)0x12c56a);
      return old_filename._4_4_;
    }
    phVar5 = hash_remove(phStack_388,
                         (hash_elem *)
                         CONCAT26(old_filename_len_ptr._6_2_,
                                  CONCAT24(old_filename_len_ptr._4_2_,old_filename_len_ptr._0_4_)));
    if (phVar5 == (hash_elem *)0x0) {
      fdb_assert_die((char *)new_filename_len_ptr,(char *)phStack_388,
                     CONCAT22(old_filename_len_ptr._6_2_,old_filename_len_ptr._4_2_),
                     (uint64_t)phStack_398,
                     CONCAT26(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60));
    }
    filemgr_free_func((hash_elem *)
                      CONCAT26(old_filename_len_ptr._6_2_,
                               CONCAT24(old_filename_len_ptr._4_2_,old_filename_len_ptr._0_4_)));
    fVar2 = filemgr_does_file_exist((char *)phStack_398);
    puVar10 = &stack0xfffffffffffffc58;
    if ((fVar2 == FDB_RESULT_SUCCESS) &&
       (iVar3 = remove(filename), puVar10 = &stack0xfffffffffffffc58, iVar3 != 0)) {
      old_filename._4_4_ = FDB_RESULT_FILE_REMOVE_FAIL;
      puVar10 = &stack0xfffffffffffffc58;
    }
  }
  if (destroy_file_set == (hash *)0x0) {
    *(undefined8 *)(puVar10 + -8) = 0x12ca0d;
    hash_free(*(hash **)(puVar10 + -8));
  }
  return old_filename._4_4_;
}

Assistant:

fdb_status filemgr_destroy_file(char *filename,
                                struct filemgr_config *config,
                                struct hash *destroy_file_set)
{
    struct filemgr *file = NULL;
    struct hash to_destroy_files;
    struct hash *destroy_set = (destroy_file_set ? destroy_file_set :
                                                  &to_destroy_files);
    struct filemgr query;
    struct hash_elem *e = NULL;
    fdb_status status = FDB_RESULT_SUCCESS;
    char *old_filename = NULL;

    if (!destroy_file_set) { // top level or non-recursive call
        hash_init(destroy_set, NBUCKET, _file_hash, _file_cmp);
    }

    query.filename = filename;
    // check whether file is already being destroyed in parent recursive call
    e = hash_find(destroy_set, &query.e);
    if (e) { // Duplicate filename found, nothing to be done in this call
        if (!destroy_file_set) { // top level or non-recursive call
            hash_free(destroy_set);
        }
        return status;
    } else {
        // Remember file. Stack value ok IFF single direction recursion
        hash_insert(destroy_set, &query.e);
    }

    // check global list of known files to see if it is already opened or not
    e = hash_find(&hash, &query.e);
    if (e) {
        // already opened (return existing structure)
        file = _get_entry(e, struct filemgr, e);

        spin_lock(&file->lock);
        if (atomic_get_uint32_t(&file->ref_count)) {
            spin_unlock(&file->lock);
            status = FDB_RESULT_FILE_IS_BUSY;
            if (!destroy_file_set) { // top level or non-recursive call
                hash_free(destroy_set);
            }
            return status;
        }
        spin_unlock(&file->lock);
        if (file->old_filename) {
            status = filemgr_destroy_file(file->old_filename, config,
                                          destroy_set);
            if (status != FDB_RESULT_SUCCESS) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return status;
            }
        }

        // Cleanup file from in-memory as well as on-disk
        e = hash_remove(&hash, &file->e);
        fdb_assert(e, e, 0);
        filemgr_free_func(&file->e);
        if (filemgr_does_file_exist(filename) == FDB_RESULT_SUCCESS) {
            if (remove(filename)) {
                status = FDB_RESULT_FILE_REMOVE_FAIL;
            }
        }
    } else { // file not in memory, read on-disk to destroy older versions..
        file = (struct filemgr *)alca(struct filemgr, 1);
        memset(file, 0x0, sizeof(struct filemgr));
        file->filename = filename;
        file->ops = get_filemgr_ops();
        file->fd = file->ops->open(file->filename, O_RDWR, 0666);
        file->blocksize = global_config.blocksize;
        file->config = (struct filemgr_config *)alca(struct filemgr_config, 1);
        *file->config = *config;
        fdb_init_encryptor(&file->encryption, &config->encryption_key);
        if (file->fd < 0) {
            if (file->fd != FDB_RESULT_NO_SUCH_FILE) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return (fdb_status) file->fd;
            }
        } else { // file successfully opened, seek to end to get DB header
            cs_off_t offset = file->ops->goto_eof(file->fd);
            if (offset < 0) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return (fdb_status) offset;
            } else { // Need to read DB header which contains old filename
                atomic_store_uint64_t(&file->pos, offset);
                // initialize CRC mode
                if (file->config && file->config->options & FILEMGR_CREATE_CRC32) {
                    file->crc_mode = CRC32;
                } else {
                    file->crc_mode = CRC_DEFAULT;
                }

                status = _filemgr_load_sb(file, NULL);
                if (status != FDB_RESULT_SUCCESS) {
                    if (!destroy_file_set) { // top level or non-recursive call
                        hash_free(destroy_set);
                    }
                    file->ops->close(file->fd);
                    return status;
                }

                status = _filemgr_read_header(file, NULL);
                if (status != FDB_RESULT_SUCCESS) {
                    if (!destroy_file_set) { // top level or non-recursive call
                        hash_free(destroy_set);
                    }
                    file->ops->close(file->fd);
                    if (sb_ops.release && file->sb) {
                        sb_ops.release(file);
                    }
                    return status;
                }
                if (file->header.data) {
                    size_t new_fnamelen_off = ver_get_new_filename_off(file->
                                                                      version);
                    size_t old_fnamelen_off = new_fnamelen_off + 2;
                    uint16_t *new_filename_len_ptr = (uint16_t *)((char *)
                                                     file->header.data
                                                     + new_fnamelen_off);
                    uint16_t new_filename_len =
                                      _endian_decode(*new_filename_len_ptr);
                    uint16_t *old_filename_len_ptr = (uint16_t *)((char *)
                                                     file->header.data
                                                     + old_fnamelen_off);
                    uint16_t old_filename_len =
                                      _endian_decode(*old_filename_len_ptr);
                    old_filename = (char *)file->header.data + old_fnamelen_off
                                   + 2 + new_filename_len;
                    if (old_filename_len) {
                        status = filemgr_destroy_file(old_filename, config,
                                                      destroy_set);
                    }
                    free(file->header.data);
                }
                file->ops->close(file->fd);
                if (sb_ops.release && file->sb) {
                    sb_ops.release(file);
                }
                if (status == FDB_RESULT_SUCCESS) {
                    if (filemgr_does_file_exist(filename)
                                               == FDB_RESULT_SUCCESS) {
                        if (remove(filename)) {
                            status = FDB_RESULT_FILE_REMOVE_FAIL;
                        }
                    }
                }
            }
        }
    }

    if (!destroy_file_set) { // top level or non-recursive call
        hash_free(destroy_set);
    }

    return status;
}